

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O0

void iutest::detail::DefaultPrintTo<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
               (undefined8 param_1,basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *param_2,
               ostream *param_3)

{
  const_iterator pvVar1;
  const_iterator end;
  const_iterator it;
  size_t count;
  size_t kMaxCount;
  iu_ostream *os_local;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *container_local;
  yes_t param_0_local;
  
  it = (const_iterator)0x0;
  std::operator<<(param_3,"{");
  end = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::begin(param_2);
  pvVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::end(param_2);
  do {
    if (end == pvVar1) {
LAB_00244090:
      if (it != (const_iterator)0x0) {
        std::operator<<(param_3," ");
      }
      std::operator<<(param_3,"}");
      return;
    }
    if ((it != (const_iterator)0x0) && (std::operator<<(param_3,","), it == (const_iterator)0x20)) {
      std::operator<<(param_3," ...");
      goto LAB_00244090;
    }
    std::operator<<(param_3," ");
    UniversalPrint<wchar_t>(end,param_3);
    end = end + 1;
    it = (const_iterator)((long)it + 1);
  } while( true );
}

Assistant:

inline void DefaultPrintTo(IsContainerHelper::yes_t
                           , iutest_type_traits::false_type
                           , const T& container, iu_ostream* os)
{
    const size_t kMaxCount = kValues::MaxPrintContainerCount;
    size_t count = 0;
    *os << "{";
    for( typename T::const_iterator it=container.begin(), end=container.end(); it != end; ++it, ++count)
    {
        if( count > 0 )
        {
            *os << ",";
            if( count == kMaxCount )
            {
                *os << " ...";
                break;
            }
        }
        *os << " ";
        UniversalPrint(*it, os);
    }
    if( count > 0 )
    {
        *os << " ";
    }
    *os << "}";
}